

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::convertToLittleEndian<unsigned_long>
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *t)

{
  ulong *local_18;
  unsigned_long *t_local;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  for (local_18 = t; *local_18 != 0; local_18 = local_18 + 1) {
    *local_18 = *local_18 >> 8 | *local_18 << 8;
  }
  return;
}

Assistant:

void convertToLittleEndian(src_char_type* t)
	{
		if (sizeof(src_char_type) == 4) 
		{
			// 32 bit

			while(*t)
			{
				*t = ((*t & 0xff000000) >> 24) |
				     ((*t & 0x00ff0000) >> 8)  |
				     ((*t & 0x0000ff00) << 8)  |
				     ((*t & 0x000000ff) << 24);
				++t;
			}
		}
		else
		{
			// 16 bit 

			while(*t)
			{
				*t = (*t >> 8) | (*t << 8);
				++t;
			}
		}
	}